

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::SetNotRanges
          (CharSet<char16_t> *this,ArenaAllocator *allocator,int numSortedPairs,Char *sortedPairs)

{
  int iVar1;
  Char lc;
  int iVar2;
  
  if (numSortedPairs == 0) {
    lc = L'\0';
  }
  else {
    if (*sortedPairs != L'\0') {
      SetRange(this,allocator,L'\0',*sortedPairs + L'\xffff');
    }
    iVar1 = numSortedPairs * 2 + -1;
    if (1 < iVar1) {
      iVar2 = 1;
      do {
        SetRange(this,allocator,sortedPairs[iVar2] + L'\x01',
                 sortedPairs[(long)iVar2 + 1] + L'\xffff');
        iVar2 = iVar2 + 2;
      } while (iVar2 < iVar1);
    }
    if (sortedPairs[iVar1] == L'\xffff') {
      return;
    }
    lc = sortedPairs[iVar1] + L'\x01';
  }
  SetRange(this,allocator,lc,L'\xffff');
  return;
}

Assistant:

void CharSet<char16>::SetNotRanges(ArenaAllocator* allocator, int numSortedPairs, const Char* sortedPairs)
    {
        if (numSortedPairs == 0)
            SetRange(allocator, MinChar, MaxChar);
        else
        {
            if (sortedPairs[0] != MinChar)
                SetRange(allocator, MinChar, sortedPairs[0] - 1);
            for (int i = 1; i < numSortedPairs * 2 - 1; i += 2)
                SetRange(allocator, sortedPairs[i] + 1, sortedPairs[i+1] - 1);
            if (sortedPairs[numSortedPairs * 2 - 1] != MaxChar)
                SetRange(allocator, sortedPairs[numSortedPairs * 2 - 1] + 1, MaxChar);
        }
    }